

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableref.cpp
# Opt level: O1

void __thiscall duckdb::TableRef::CopyProperties(TableRef *this,TableRef *target)

{
  pointer pSVar1;
  pointer local_20;
  
  ::std::__cxx11::string::_M_assign((string *)&target->alias);
  (target->query_location).index = (this->query_location).index;
  if ((this->sample).
      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
      super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl == (SampleOptions *)0x0) {
    local_20 = (pointer)0x0;
  }
  else {
    unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::operator->
              (&this->sample);
    SampleOptions::Copy((SampleOptions *)&local_20);
  }
  pSVar1 = local_20;
  local_20 = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::reset
            ((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             &target->sample,pSVar1);
  pSVar1 = local_20;
  if (local_20 != (pointer)0x0) {
    Value::~Value(&local_20->sample_size);
    operator_delete(pSVar1);
  }
  shared_ptr<duckdb::ExternalDependency,_true>::operator=
            (&target->external_dependency,&this->external_dependency);
  return;
}

Assistant:

void TableRef::CopyProperties(TableRef &target) const {
	D_ASSERT(type == target.type);
	target.alias = alias;
	target.query_location = query_location;
	target.sample = sample ? sample->Copy() : nullptr;
	target.external_dependency = external_dependency;
}